

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void libxml_xmlXPathFuncCallback(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr pxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  int iVar4;
  PyObject *op;
  PyObject *pPVar5;
  xmlXPathObjectPtr pxVar6;
  int local_5c;
  int i;
  xmlChar *ns_uri;
  xmlChar *name;
  PyObject *current_function;
  xmlXPathContextPtr rctxt;
  xmlXPathObjectPtr obj;
  PyObject *result;
  PyObject *cur;
  PyObject *list;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  name = (xmlChar *)0x0;
  if ((ctxt != (xmlXPathParserContextPtr)0x0) &&
     (pxVar1 = ctxt->context, pxVar1 != (xmlXPathContextPtr)0x0)) {
    pxVar2 = pxVar1->function;
    pxVar3 = pxVar1->functionURI;
    for (local_5c = 0; local_5c < libxml_xpathCallbacksNb; local_5c = local_5c + 1) {
      iVar4 = xmlStrEqual(pxVar2,*(undefined8 *)(libxml_xpathCallbacks + (long)local_5c * 0x20 + 8))
      ;
      if ((iVar4 != 0) &&
         (iVar4 = xmlStrEqual(pxVar3,*(undefined8 *)
                                      (libxml_xpathCallbacks + (long)local_5c * 0x20 + 0x10)),
         iVar4 != 0)) {
        name = *(xmlChar **)(libxml_xpathCallbacks + (long)local_5c * 0x20 + 0x18);
      }
    }
    if (name == (xmlChar *)0x0) {
      printf("libxml_xmlXPathFuncCallback: internal error %s not found !\n",pxVar2);
    }
    else {
      op = (PyObject *)PyTuple_New((long)(nargs + 1));
      pPVar5 = libxml_xmlXPathParserContextPtrWrap(ctxt);
      PyTuple_SetItem(op,0,pPVar5);
      for (local_5c = nargs + -1; -1 < local_5c; local_5c = local_5c + -1) {
        pxVar6 = (xmlXPathObjectPtr)valuePop(ctxt);
        pPVar5 = libxml_xmlXPathObjectPtrWrap(pxVar6);
        PyTuple_SetItem(op,(long)(local_5c + 1),pPVar5);
      }
      pPVar5 = (PyObject *)PyObject_CallObject(name,op);
      _Py_DECREF(op);
      pxVar6 = libxml_xmlXPathObjectPtrConvert(pPVar5);
      valuePush(ctxt,pxVar6);
    }
  }
  return;
}

Assistant:

static void
libxml_xmlXPathFuncCallback(xmlXPathParserContextPtr ctxt, int nargs)
{
    PyObject *list, *cur, *result;
    xmlXPathObjectPtr obj;
    xmlXPathContextPtr rctxt;
    PyObject *current_function = NULL;
    const xmlChar *name;
    const xmlChar *ns_uri;
    int i;

    if (ctxt == NULL)
        return;
    rctxt = ctxt->context;
    if (rctxt == NULL)
        return;
    name = rctxt->function;
    ns_uri = rctxt->functionURI;

    /*
     * Find the function, it should be there it was there at lookup
     */
    for (i = 0; i < libxml_xpathCallbacksNb; i++) {
        if (                    /* TODO (ctxt == libxml_xpathCallbacks[i].ctx) && */
						(xmlStrEqual(name, (*libxml_xpathCallbacks)[i].name)) &&
               (xmlStrEqual(ns_uri, (*libxml_xpathCallbacks)[i].ns_uri))) {
					current_function = (*libxml_xpathCallbacks)[i].function;
        }
    }
    if (current_function == NULL) {
        printf
            ("libxml_xmlXPathFuncCallback: internal error %s not found !\n",
             name);
        return;
    }

    list = PyTuple_New(nargs + 1);
    PyTuple_SetItem(list, 0, libxml_xmlXPathParserContextPtrWrap(ctxt));
    for (i = nargs - 1; i >= 0; i--) {
        obj = valuePop(ctxt);
        cur = libxml_xmlXPathObjectPtrWrap(obj);
        PyTuple_SetItem(list, i + 1, cur);
    }
    result = PyObject_CallObject(current_function, list);
    Py_DECREF(list);

    obj = libxml_xmlXPathObjectPtrConvert(result);
    valuePush(ctxt, obj);
}